

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O0

size_t __thiscall
GrcFont::AutoPseudos
          (GrcFont *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *vnUnicode,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vwGlyphID)

{
  bool bVar1;
  reference puVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_RDI;
  utf16 wchGlyph;
  uint nUnicode;
  uint collision;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  size_type_conflict nSize;
  GdlObject *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb8;
  utf16 in_stack_ffffffffffffffbe;
  uint uVar3;
  uint uVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *local_28;
  size_type_conflict local_20;
  
  local_20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x20));
  local_28 = in_RDI + 0x20;
  local_30._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffffa8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_30);
    uVar3 = *puVar2;
    uVar4 = uVar3;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar3,uVar3),
               (value_type_conflict *)CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8))
    ;
    in_stack_ffffffffffffffbe =
         GlyphFromCmap((GrcFont *)CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8),
                       (uint)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)CONCAT44(uVar4,uVar3),
               (value_type_conflict2 *)CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)
              );
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_30);
  }
  return local_20;
}

Assistant:

size_t GrcFont::AutoPseudos(std::vector<unsigned int> & vnUnicode, std::vector<utf16> & vwGlyphID)
{
#ifdef _DEBUG
	if (m_fDebug)
		return 0;
#endif

	Assert(m_pFile); // insure Init() called
	Assert(m_nMaxGlyfId != -1); // insure ScanGlyfIds() called
	Assert(m_pCmap_3_10 || m_pCmap_3_1);
	
	// Fill the vectors with Unicode values that have duplicate glyph IDs and with the
	// glyph IDs that parallel the Unicode values.
	auto nSize = m_vnCollisions.size();
	for (auto const collision: m_vnCollisions)
	{
		unsigned int nUnicode = collision;
		vnUnicode.push_back(nUnicode);
		utf16 wchGlyph = GlyphFromCmap(nUnicode, NULL);
		vwGlyphID.push_back(wchGlyph);
	}
	return nSize;
}